

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O1

rt_expression_interface<double> * __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::substitute
          (rt_unary_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_expression_interface<double> *e,rt_expression_interface<double> *repl)

{
  rt_expression_interface<double> *prVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  rt_expression_interface<double> *prVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar2 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])();
  if ((char)iVar2 != '\0') {
    iVar2 = (*repl->_vptr_rt_expression_interface[2])(repl);
    return (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2);
  }
  prVar4 = (rt_expression_interface<double> *)operator_new(0x18);
  prVar1 = (this->expr_)._M_ptr;
  iVar2 = (*prVar1->_vptr_rt_expression_interface[0xe])(prVar1,e,repl);
  iVar3 = (*((this->op_)._M_ptr)->_vptr_op_interface[2])();
  prVar4->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_unary_expr_00125ce0;
  prVar4[1]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_00,iVar2);
  prVar4[2]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_01,iVar3);
  return prVar4;
}

Assistant:

InterfaceType * substitute(const InterfaceType * e,
                                 const InterfaceType * repl) const
      {
        if (deep_equal(e))
          return repl->clone();

        return new rt_unary_expr(expr_->substitute(e, repl),
                              op_->clone());
      }